

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

int cmCommandExists(void *arg,char *name)

{
  cmState *this;
  allocator<char> local_59;
  string local_58;
  _Any_data local_38;
  code *local_28;
  
  this = cmMakefile::GetState((cmMakefile *)arg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_59);
  cmState::GetCommand((Command *)&local_38,this,&local_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (int)(local_28 != (code *)0x0);
}

Assistant:

static int CCONV cmCommandExists(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return static_cast<int>(mf->GetState()->GetCommand(name) ? 1 : 0);
}